

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

SP __thiscall pbrt::SemanticParser::emitDisk(SemanticParser *this,SP *shape)

{
  element_type *peVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  bool bVar14;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  float fVar16;
  SP SVar17;
  undefined1 local_99;
  undefined1 local_98 [32];
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  SP local_60;
  SP local_50;
  undefined8 local_40;
  _Base_ptr local_38;
  
  local_40 = *(undefined8 *)(*in_RDX + 0x58);
  local_38 = *(_Base_ptr *)(*in_RDX + 0x60);
  if (local_38 != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_38->_M_parent = *(int *)&local_38->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_38->_M_parent = *(int *)&local_38->_M_parent + 1;
    }
  }
  findOrCreateMaterial((SemanticParser *)local_98,(SP *)shape);
  std::__shared_ptr<pbrt::Disk,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::Disk>,std::shared_ptr<pbrt::Material>>
            ((__shared_ptr<pbrt::Disk,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             (allocator<pbrt::Disk> *)&local_99,(shared_ptr<pbrt::Material> *)local_98);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
  }
  if (local_38 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  lVar2 = *in_RDX;
  uVar3 = *(undefined4 *)(lVar2 + 0x78);
  uVar4 = *(undefined4 *)(lVar2 + 0x7c);
  uVar5 = *(undefined4 *)(lVar2 + 0x80);
  uVar6 = *(undefined4 *)(lVar2 + 0x84);
  uVar7 = *(undefined4 *)(lVar2 + 0x88);
  uVar8 = *(undefined4 *)(lVar2 + 0x8c);
  uVar9 = *(undefined4 *)(lVar2 + 0x90);
  uVar10 = *(undefined4 *)(lVar2 + 0x94);
  uVar11 = *(undefined4 *)(lVar2 + 0x9c);
  uVar12 = *(undefined4 *)(lVar2 + 0xa0);
  uVar13 = *(undefined4 *)(lVar2 + 0xa4);
  *(undefined4 *)
   &((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&local_78[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
            super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       *(undefined4 *)(lVar2 + 0x98);
  *(undefined4 *)
   ((long)&local_78[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
           super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 0xc) = uVar11;
  *(undefined4 *)
   &local_78[1].cameras.
    super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
    ._M_impl.super__Vector_impl_data = uVar12;
  *(undefined4 *)
   ((long)&local_78[1].cameras.
           super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
           ._M_impl.super__Vector_impl_data + 4) = uVar13;
  *(undefined4 *)&local_78[1].super_Entity._vptr_Entity = uVar7;
  *(undefined4 *)((long)&local_78[1].super_Entity._vptr_Entity + 4) = uVar8;
  *(undefined4 *)
   &local_78[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar9;
  *(undefined4 *)
   ((long)&local_78[1].super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
           super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 4) = uVar10;
  *(undefined4 *)
   &(local_78->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar3;
  *(undefined4 *)
   ((long)&(local_78->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
   ) = uVar4;
  *(undefined4 *)
   &(local_78->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = uVar5;
  *(undefined4 *)
   ((long)&(local_78->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar6;
  lVar2 = *in_RDX;
  peVar1 = (element_type *)(local_98 + 0x10);
  local_98._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"radius","");
  fVar16 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),(string *)local_98,0.0);
  *(float *)((long)&local_78[1].cameras.
                    super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                    ._M_impl.super__Vector_impl_data + 8) = fVar16;
  if ((element_type *)local_98._0_8_ != peVar1) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
  lVar2 = *in_RDX;
  local_98._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"height","");
  bVar14 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar2 + 8),(string *)local_98);
  if ((element_type *)local_98._0_8_ != peVar1) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
  if (bVar14) {
    lVar2 = *in_RDX;
    local_98._0_8_ = peVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"height","");
    fVar16 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),(string *)local_98,0.0);
    *(float *)((long)&local_78[1].cameras.
                      super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                      ._M_impl.super__Vector_impl_data + 0xc) = fVar16;
    if ((element_type *)local_98._0_8_ != peVar1) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
  }
  local_50.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78;
  local_50.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_70;
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_70->_M_use_count = p_Stack_70->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_70->_M_use_count = p_Stack_70->_M_use_count + 1;
    }
  }
  local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RDX;
  local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if ((_Base_ptr)
      local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((_Base_ptr)
               local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
      UNLOCK();
    }
    else {
      *(int *)&((_Base_ptr)
               local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_parent =
           *(int *)&((_Base_ptr)
                    local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_parent + 1;
    }
  }
  extractTextures((SemanticParser *)shape,&local_50,&local_60);
  _Var15._M_pi = extraout_RDX;
  if ((_Base_ptr)
      local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var15._M_pi = extraout_RDX_00;
  }
  if (local_50.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var15._M_pi = extraout_RDX_01;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_70;
  SVar17.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var15._M_pi;
  SVar17.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar17.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitDisk(pbrt::syntactic::Shape::SP shape)
  {
    Disk::SP ours = std::make_shared<Disk>(findOrCreateMaterial(shape->material));

    ours->transform = shape->transform.atStart;
    ours->radius    = shape->getParam1f("radius");
        
    if (shape->hasParam1f("height"))
      ours->height    = shape->getParam1f("height");
        
    extractTextures(ours,shape);
      
    return ours;
  }